

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fASTCDecompressionCases.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D::ASTCRenderer2D
          (ASTCRenderer2D *this,Context *context,CompressedTexFormat format,deUint32 randomSeed)

{
  tcu local_44 [12];
  VecAccess<int,_3,_2> local_38;
  
  this->m_context = context;
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,context->m_renderCtx,context->m_testCtx->m_log,GLSL_VERSION_300_ES,
             PRECISION_HIGHP);
  this->m_format = format;
  tcu::getBlockPixelSize(local_44,format);
  local_38.m_index[0] = 0;
  local_38.m_index[1] = 1;
  local_38.m_vector = (Vector<int,_3> *)local_44;
  tcu::VecAccess::operator_cast_to_Vector(&local_38);
  this->m_astcSupport = ASTCSUPPORTLEVEL_NONE;
  tcu::Vector<float,_4>::Vector(&this->m_colorScale,-1.0);
  tcu::Vector<float,_4>::Vector(&this->m_colorBias,-1.0);
  deRandom_init(&(this->m_rnd).m_rnd,randomSeed);
  this->m_initialized = false;
  return;
}

Assistant:

ASTCRenderer2D::ASTCRenderer2D (Context&			context,
								CompressedTexFormat	format,
								deUint32			randomSeed)
	: m_context			(context)
	, m_renderer		(context.getRenderContext(), context.getTestContext().getLog(), glu::GLSL_VERSION_300_ES, glu::PRECISION_HIGHP)
	, m_format			(format)
	, m_blockSize		(tcu::getBlockPixelSize(format).xy())
	, m_astcSupport		(ASTCSUPPORTLEVEL_NONE)
	, m_colorScale		(-1.0f)
	, m_colorBias		(-1.0f)
	, m_rnd				(randomSeed)
	, m_initialized		(false)
{
	DE_ASSERT(tcu::getBlockPixelSize(format).z() == 1);
}